

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O0

int count_bits(int offset,int len)

{
  int iVar1;
  int iVar2;
  int len_local;
  int offset_local;
  
  iVar1 = 8;
  if (0x80 < offset) {
    iVar1 = 0xc;
  }
  iVar2 = elias_gamma_bits(len + -1);
  return iVar1 + 1 + iVar2;
}

Assistant:

int count_bits(int offset, int len) {
    return 1 + (offset > 128 ? 12 : 8) + elias_gamma_bits(len-1);
}